

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O1

void anon_unknown.dwarf_285dd0::runtests(bool nonfatal,bool tiny)

{
  int banks;
  long lVar1;
  char **channels;
  char **passivechannels;
  long *plVar2;
  PixelType *pt;
  char **channels_00;
  PixelType *pt_00;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  int *piVar9;
  long lVar10;
  undefined4 *puVar11;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  *this;
  Vec2<int> *pVVar12;
  Header *hdr_00;
  undefined1 nonfatal_00;
  char **passivechannels_00;
  undefined1 *puVar13;
  char *pcVar14;
  long lVar15;
  allocator<char> local_339;
  undefined1 local_338 [32];
  _Base_ptr p_Stack_318;
  size_t local_310;
  InputFile infile;
  long local_2f0;
  FrameBuffer readFrameBuf;
  FrameBuffer preReadFrameBuf;
  undefined1 *local_280;
  char *local_278;
  FrameBuffer writeFrameBuf;
  Box2i local_1f8;
  Header hdr;
  long local_1d8;
  long local_1d0 [5];
  ostringstream q;
  ios_base local_138 [264];
  
  random_reseed(1);
  (anonymous_namespace)::gSuccesses = 0;
  (anonymous_namespace)::gOptimisedReads = 0;
  local_2f0 = 0;
  local_278 = "RGBHalf";
  local_280 = (anonymous_namespace)::Schemes;
  do {
    lVar15 = 0;
    pcVar14 = "RGBHalf";
    puVar13 = (anonymous_namespace)::Schemes;
    do {
      lVar10 = std::cout;
      *(uint *)(&Imf_3_2::TypedAttribute<int>::typeinfo + *(long *)(std::cout + -0x18)) =
           *(uint *)(&Imf_3_2::TypedAttribute<int>::typeinfo + *(long *)(std::cout + -0x18)) &
           0xffffff4f | 0x80;
      *(undefined8 *)(IlmThread_3_2::ThreadPool::ThreadPool + *(long *)(lVar10 + -0x18)) = 2;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_2f0);
      q = (ostringstream)0x2c;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&q,1);
      lVar10 = *(long *)poVar7;
      lVar1 = *(long *)(lVar10 + -0x18);
      *(uint *)(poVar7 + lVar1 + 0x18) = *(uint *)(poVar7 + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar7 + *(long *)(lVar10 + -0x18) + 0x10) = 2;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)lVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      std::ostream::flush();
      channels = *(char ***)(local_280 + 8);
      passivechannels = *(char ***)(local_280 + 0x10);
      iVar6 = *(int *)(local_280 + 0x18);
      plVar2 = *(long **)(local_280 + 0x20);
      pt = *(PixelType **)(local_280 + 0x28);
      channels_00 = *(char ***)(puVar13 + 8);
      passivechannels_00 = *(char ***)(puVar13 + 0x10);
      banks = *(int *)(puVar13 + 0x18);
      pt_00 = *(PixelType **)(puVar13 + 0x28);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&q);
      sVar8 = strlen(local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,local_278,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q," read as ",9);
      sVar8 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,pcVar14,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,"...",3);
      lVar10 = std::cout;
      *(uint *)(&Imf_3_2::TypedAttribute<int>::typeinfo + *(long *)(std::cout + -0x18)) =
           *(uint *)(&Imf_3_2::TypedAttribute<int>::typeinfo + *(long *)(std::cout + -0x18)) &
           0xffffff4f | 0x20;
      *(undefined8 *)(IlmThread_3_2::ThreadPool::ThreadPool + *(long *)(lVar10 + -0x18)) = 0x35;
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)_hdr,local_1d8);
      if (_hdr != local_1d0) {
        operator_delete(_hdr,local_1d0[0] + 1);
      }
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readFrameBuf._map._M_t._M_impl._0_8_ = 0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Header::Header
                (&hdr,0x80,0x80,1.0,(Vec2 *)&readFrameBuf,1.0,INCREASING_Y,ZIP_COMPRESSION);
      iVar4 = random_int(0xc9);
      piVar9 = (int *)Imf_3_2::Header::dataWindow();
      *piVar9 = iVar4 + -100;
      iVar4 = random_int(0xc9);
      lVar10 = Imf_3_2::Header::dataWindow();
      *(int *)(lVar10 + 4) = iVar4 + -100;
      if (nonfatal) {
        piVar9 = (int *)Imf_3_2::Header::dataWindow();
        iVar4 = *piVar9;
        iVar5 = random_int(0xe);
        lVar10 = Imf_3_2::Header::dataWindow();
        *(int *)(lVar10 + 8) = iVar5 + iVar4 + 1;
        lVar10 = Imf_3_2::Header::dataWindow();
        iVar4 = *(int *)(lVar10 + 4);
        iVar5 = random_int(0xe);
        lVar10 = Imf_3_2::Header::dataWindow();
        iVar4 = iVar5 + iVar4 + 1;
      }
      else {
        piVar9 = (int *)Imf_3_2::Header::dataWindow();
        iVar4 = *piVar9;
        iVar5 = random_int(400);
        lVar10 = Imf_3_2::Header::dataWindow();
        *(int *)(lVar10 + 8) = iVar5 + iVar4 + 0x40;
        lVar10 = Imf_3_2::Header::dataWindow();
        iVar4 = *(int *)(lVar10 + 4);
        iVar5 = random_int(400);
        lVar10 = Imf_3_2::Header::dataWindow();
        iVar4 = iVar5 + iVar4 + 0x40;
      }
      *(int *)(lVar10 + 0xc) = iVar4;
      puVar11 = (undefined4 *)Imf_3_2::Header::compression();
      *puVar11 = 2;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setupBuffer((ChannelList *)local_338,&hdr,channels,passivechannels,pt,&writeFrameBuf,
                  &readFrameBuf,&preReadFrameBuf,iVar6,true);
      this = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
              *)Imf_3_2::Header::channels();
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
      ::clear(this);
      if ((_Base_ptr)local_338._16_8_ != (_Base_ptr)0x0) {
        (this->_M_impl).super__Rb_tree_header._M_header._M_color = local_338._8_4_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_338._16_8_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_338._24_8_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_right = p_Stack_318;
        *(_Rb_tree_header **)(local_338._16_8_ + 8) = &(this->_M_impl).super__Rb_tree_header;
        (this->_M_impl).super__Rb_tree_header._M_node_count = local_310;
        local_338._16_8_ = (_Base_ptr)0x0;
        local_338._24_8_ = local_338 + 8;
        local_310 = 0;
        p_Stack_318 = (_Base_ptr)local_338._24_8_;
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                   *)local_338);
      if (plVar2 != (long *)0x0) {
        _infile = 0;
        lVar10 = *plVar2;
        while (lVar10 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_338,(char *)*plVar2,&local_339);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&infile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338)
          ;
          if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
          }
          lVar10 = plVar2[1];
          plVar2 = plVar2 + 1;
        }
        Imf_3_2::addMultiView(&hdr,(vector *)&infile);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&infile);
      }
      remove((anonymous_namespace)::filename_abi_cxx11_);
      pcVar14 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::OutputFile::OutputFile((OutputFile *)local_338,pcVar14,&hdr,iVar6);
      Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)local_338);
      Imf_3_2::Header::dataWindow();
      Imf_3_2::Header::dataWindow();
      Imf_3_2::OutputFile::writePixels((int)(OutputFile *)local_338);
      pVVar12 = (Vec2<int> *)Imf_3_2::Header::dataWindow();
      local_1f8.min = *pVVar12;
      local_1f8.max = pVVar12[1];
      Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_338);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&readFrameBuf);
      Imf_3_2::Header::~Header(&hdr);
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_338._8_4_ = _S_red;
      local_338._16_8_ = (_Base_ptr)0x0;
      local_338._24_8_ = local_338 + 8;
      local_310 = 0;
      p_Stack_318 = (_Base_ptr)local_338._24_8_;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::ostream::flush();
      pcVar14 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile(&infile,pcVar14,iVar6);
      hdr_00 = (Header *)Imf_3_2::InputFile::header();
      setupBuffer((ChannelList *)&hdr,hdr_00,channels_00,passivechannels_00,pt_00,&readFrameBuf,
                  &preReadFrameBuf,(FrameBuffer *)local_338,banks,false);
      nonfatal_00 = SUB81(passivechannels_00,0);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                   *)&hdr);
      Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&infile);
      std::ostream::flush();
      Imf_3_2::InputFile::header();
      lVar10 = Imf_3_2::Header::dataWindow();
      iVar6 = *(int *)(lVar10 + 4);
      Imf_3_2::InputFile::header();
      Imf_3_2::Header::dataWindow();
      Imf_3_2::InputFile::readPixels((int)&infile,iVar6);
      cVar3 = Imf_3_2::InputFile::isOptimizationEnabled();
      Imf_3_2::InputFile::~InputFile(&infile);
      compare(&readFrameBuf,&writeFrameBuf,&local_1f8,(bool)nonfatal_00);
      compare(&preReadFrameBuf,(FrameBuffer *)local_338,&local_1f8,(bool)nonfatal_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," OK ",4);
      if (cVar3 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OPTIMISED ",10);
        (anonymous_namespace)::gOptimisedReads = (anonymous_namespace)::gOptimisedReads + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      (anonymous_namespace)::gSuccesses = (anonymous_namespace)::gSuccesses + 1;
      remove((anonymous_namespace)::filename_abi_cxx11_);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)local_338);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&readFrameBuf);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&writeFrameBuf);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&q);
      std::ios_base::~ios_base(local_138);
      lVar15 = lVar15 + 1;
      puVar13 = (anonymous_namespace)::Schemes + lVar15 * 0x30;
      pcVar14 = *(char **)((anonymous_namespace)::Schemes + lVar15 * 0x30);
    } while (lVar15 != 0x23);
    local_2f0 = local_2f0 + 1;
    local_280 = (anonymous_namespace)::Schemes + local_2f0 * 0x30;
    local_278 = *(char **)((anonymous_namespace)::Schemes + local_2f0 * 0x30);
  } while (local_2f0 != 0x23);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,0);
  q = (ostringstream)0x2f;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&q,1);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(anonymous_namespace)::gSuccesses);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," runs failed\n",0xd);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," tests skipped (assumed to be bad)\n",0x23);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(anonymous_namespace)::gOptimisedReads);
  q = (ostringstream)0x2f;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&q,1);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(anonymous_namespace)::gSuccesses);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," optimised\n",0xb);
  return;
}

Assistant:

void
runtests (bool nonfatal, bool tiny)
{
    random_reseed (1);
    int i       = 0;
    int skipped = 0;

    gFailures       = 0;
    gSuccesses      = 0;
    gOptimisedReads = 0;

    while (Schemes[i]._name != NULL)
    {
        int j = 0;
        while (Schemes[j]._name != NULL)
        {
            cout << right << setw (2) << i << ',' << right << setw (2) << j
                 << ": ";
            cout.flush ();

            if (nonfatal)
            {
                cout << " skipping " << Schemes[i]._name << ','
                     << Schemes[j]._name << ": known to crash\n";
                skipped++;
            }
            else
            {
                test (Schemes[i], Schemes[j], nonfatal, tiny);
            }
            j++;
        }
        i++;
    }

    cout << gFailures << '/' << (gSuccesses + gFailures) << " runs failed\n";
    cout << skipped << " tests skipped (assumed to be bad)\n";
    cout << gOptimisedReads << '/' << gSuccesses << " optimised\n";

    if (gFailures > 0)
    {
        cout << " TESTS FAILED\n";
        assert (false);
    }
}